

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void remove_tractor_beam_from_both_ships(Am_Object *beam)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30 [3];
  Am_Object local_18;
  Am_Object ship;
  Am_Object *beam_local;
  
  ship.data = (Am_Object_Data *)beam;
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)beam,(ulong)TB_SOURCE);
  Am_Object::Am_Object(&local_18,pAVar2);
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) != 0) {
    Am_Object::Am_Object(local_30,(Am_Object *)beam);
    Am_Object::Am_Object(&local_38,(Am_Object *)&local_18);
    remove_tractor_beam_from_ship(local_30,&local_38);
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(local_30);
  }
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)beam,(ulong)TB_DEST);
  Am_Object::operator=(&local_18,pAVar2);
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) != 0) {
    Am_Object::Am_Object(&local_40,(Am_Object *)beam);
    Am_Object::Am_Object(&local_48,(Am_Object *)&local_18);
    remove_tractor_beam_from_ship(&local_40,&local_48);
    Am_Object::~Am_Object(&local_48);
    Am_Object::~Am_Object(&local_40);
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

void
remove_tractor_beam_from_both_ships(Am_Object beam)
{
  Am_Object ship = (Am_Object)(beam.Get(TB_SOURCE));
  if (ship.Valid())
    remove_tractor_beam_from_ship(beam, ship);
  ship = beam.Get(TB_DEST);
  if (ship.Valid())
    remove_tractor_beam_from_ship(beam, ship);
}